

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O3

LY_ERR json_print_member(jsonpr_ctx *pctx,lyd_node *node,ly_bool is_attr)

{
  ushort uVar1;
  int iVar2;
  LY_ERR LVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char *format;
  ly_out *out;
  char *pcVar7;
  uint uVar8;
  
  uVar1 = pctx->level;
  if (uVar1 <= pctx->level_printed) {
    pcVar5 = "";
    if ((pctx->options & 2) == 0) {
      pcVar5 = "\n";
    }
    ly_print_(pctx->out,",%s",pcVar5);
    uVar1 = pctx->level;
  }
  if ((uVar1 == 1) || (iVar2 = json_nscmp(node,pctx->parent), iVar2 != 0)) {
    out = pctx->out;
    uVar8 = 0;
    if ((pctx->options & 2) == 0) {
      uVar8 = (uint)pctx->level * 2;
    }
    pcVar5 = "@";
    if (is_attr == '\0') {
      pcVar5 = "";
    }
    pcVar4 = node_prefix(node);
    format = "%*s\"%s%s:%s\":%s";
    uVar6 = (ulong)uVar8;
    pcVar7 = node->schema->name;
  }
  else {
    out = pctx->out;
    uVar6 = 0;
    pcVar7 = "\t";
    if ((pctx->options & 2) == 0) {
      uVar6 = (ulong)((uint)pctx->level * 2);
      pcVar7 = ", ";
    }
    pcVar7 = pcVar7 + 1;
    pcVar5 = "@";
    if (is_attr == '\0') {
      pcVar5 = "";
    }
    pcVar4 = node->schema->name;
    format = "%*s\"%s%s\":%s";
  }
  LVar3 = ly_print_(out,format,uVar6,"",pcVar5,pcVar4,pcVar7);
  return LVar3;
}

Assistant:

static LY_ERR
json_print_member(struct jsonpr_ctx *pctx, const struct lyd_node *node, ly_bool is_attr)
{
    PRINT_COMMA;
    if ((LEVEL == 1) || json_nscmp(node, pctx->parent)) {
        /* print "namespace" */
        ly_print_(pctx->out, "%*s\"%s%s:%s\":%s", INDENT, is_attr ? "@" : "",
                node_prefix(node), node->schema->name, DO_FORMAT ? " " : "");
    } else {
        ly_print_(pctx->out, "%*s\"%s%s\":%s", INDENT, is_attr ? "@" : "", node->schema->name, DO_FORMAT ? " " : "");
    }

    return LY_SUCCESS;
}